

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_validate_file_archive(char *pFilename,mz_uint flags,mz_zip_error *pErr)

{
  mz_bool mVar1;
  mz_zip_mode local_a4;
  undefined1 local_a0 [4];
  mz_zip_error actual_err;
  mz_zip_archive zip;
  mz_bool success;
  mz_zip_error *pErr_local;
  mz_uint flags_local;
  char *pFilename_local;
  
  zip.m_pState._4_4_ = 1;
  local_a4 = MZ_ZIP_MODE_INVALID;
  if (pFilename == (char *)0x0) {
    if (pErr != (mz_zip_error *)0x0) {
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    }
    pFilename_local._4_4_ = 0;
  }
  else {
    mz_zip_zero_struct((mz_zip_archive *)local_a0);
    mVar1 = mz_zip_reader_init_file_v2((mz_zip_archive *)local_a0,pFilename,flags,0,0);
    if (mVar1 == 0) {
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = zip.m_zip_mode;
      }
      pFilename_local._4_4_ = 0;
    }
    else {
      mVar1 = mz_zip_validate_archive((mz_zip_archive *)local_a0,flags);
      if (mVar1 == 0) {
        local_a4 = zip.m_zip_mode;
        zip.m_pState._4_4_ = 0;
      }
      mVar1 = mz_zip_reader_end_internal((mz_zip_archive *)local_a0,zip.m_pState._4_4_);
      if (mVar1 == 0) {
        if (local_a4 == MZ_ZIP_MODE_INVALID) {
          local_a4 = zip.m_zip_mode;
        }
        zip.m_pState._4_4_ = 0;
      }
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = local_a4;
      }
      pFilename_local._4_4_ = zip.m_pState._4_4_;
    }
  }
  return pFilename_local._4_4_;
}

Assistant:

mz_bool mz_zip_validate_file_archive(const char *pFilename, mz_uint flags, mz_zip_error *pErr)
{
    mz_bool success = MZ_TRUE;
    mz_zip_archive zip;
    mz_zip_error actual_err = MZ_ZIP_NO_ERROR;

    if (!pFilename)
    {
        if (pErr)
            *pErr = MZ_ZIP_INVALID_PARAMETER;
        return MZ_FALSE;
    }

    mz_zip_zero_struct(&zip);

    if (!mz_zip_reader_init_file_v2(&zip, pFilename, flags, 0, 0))
    {
        if (pErr)
            *pErr = zip.m_last_error;
        return MZ_FALSE;
    }

    if (!mz_zip_validate_archive(&zip, flags))
    {
        actual_err = zip.m_last_error;
        success = MZ_FALSE;
    }

    if (!mz_zip_reader_end_internal(&zip, success))
    {
        if (!actual_err)
            actual_err = zip.m_last_error;
        success = MZ_FALSE;
    }

    if (pErr)
        *pErr = actual_err;

    return success;
}